

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_ieee754_pi(asmcode *code,compiler_options *param_2)

{
  operand local_80 [2];
  operation local_78 [2];
  operand local_70 [2];
  operation local_68 [2];
  operand local_60;
  operation local_5c [2];
  operand local_54 [2];
  operation local_4c;
  operand local_48 [2];
  operation local_40 [2];
  operand local_38 [2];
  operation local_30;
  operand local_2c [2];
  operation local_24;
  uint64_t local_20;
  uint64_t header;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  header = (uint64_t)param_2;
  param_1_local = (compiler_options *)code;
  local_20 = make_block_header(1,T_FLONUM);
  local_24 = MOV;
  local_2c[1] = 10;
  local_2c[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_24,local_2c + 1,local_2c);
  local_30 = OR;
  local_38[1] = 10;
  local_38[0] = NUMBER;
  local_40[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_30,local_38 + 1,local_38,(int *)(local_40 + 1));
  local_40[0] = MOV;
  local_48[1] = 9;
  local_48[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            ((asmcode *)param_1_local,local_40,local_48 + 1,local_48,&local_20);
  local_4c = MOV;
  local_54[1] = 0x20;
  local_54[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_4c,local_54 + 1,local_54);
  local_5c[1] = 0x19;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_5c + 1);
  local_5c[0] = FSTP;
  local_60 = MEM_RBP;
  local_68[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_5c,&local_60,(int *)(local_68 + 1));
  local_68[0] = ADD;
  local_70[1] = 0x10;
  local_70[0] = NUMBER;
  local_78[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_68,local_70 + 1,local_70,(int *)(local_78 + 1));
  local_78[0] = MOV;
  local_80[1] = 9;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_78,local_80 + 1,local_80);
  return;
}

Assistant:

void inline_ieee754_pi(ASM::asmcode& code, const compiler_options&)
  {
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FLDPI);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }